

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorTorque::ChShaftsMotorTorque
          (ChShaftsMotorTorque *this,ChShaftsMotorTorque *other)

{
  undefined1 auVar1 [32];
  
  ChObj::ChObj((ChObj *)this);
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data + 4) = auVar1;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.system =
       (ChSystem *)auVar1._0_8_;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar1._8_16_;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  *(undefined1 (*) [32])&(this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1 =
       ZEXT1632(ZEXT816(0) << 0x40);
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotorTorque_00b4b9e0;
  (this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(other->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

ChShaftsMotorTorque::ChShaftsMotorTorque(const ChShaftsMotorTorque& other) : ChShaftsMotorBase(other) {

    this->f_torque = other.f_torque;
}